

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O2

void __thiscall
dg::SubgraphNode<dg::dda::RWNode>::insertBefore(SubgraphNode<dg::dda::RWNode> *this,RWNode *n)

{
  pointer ppRVar1;
  RWNode *pRVar2;
  pointer ppRVar3;
  pointer ppRVar4;
  uint uVar5;
  ulong uVar6;
  
  std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::_Vector_impl_data::
  _M_swap_data((_Vector_impl_data *)&this->_predecessors,
               (_Vector_impl_data *)&(n->super_SubgraphNode<dg::dda::RWNode>)._predecessors);
  addSuccessor(this,n);
  ppRVar1 = (this->_predecessors).
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppRVar4 = (this->_predecessors).
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppRVar4 != ppRVar1; ppRVar4 = ppRVar4 + 1) {
    pRVar2 = *ppRVar4;
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      ppRVar3 = (pRVar2->super_SubgraphNode<dg::dda::RWNode>)._successors.
                super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(pRVar2->super_SubgraphNode<dg::dda::RWNode>)._successors.
                        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3) <= uVar6)
      break;
      if (ppRVar3[uVar6] == n) {
        ppRVar3[uVar6] = (RWNode *)&this[-1].size;
      }
      uVar5 = uVar5 + 1;
    }
  }
  return;
}

Assistant:

void insertBefore(NodeT *n) {
        assert(n && "Passed nullptr as the node");
        assert(predecessorsNum() == 0);
        assert(successorsNum() == 0);

        // take over predecessors
        _predecessors.swap(n->_predecessors);

        // 'n' is a successors of this node
        addSuccessor(n);

        // replace the reference to n in predecessors
        for (NodeT *pred : _predecessors) {
            for (unsigned i = 0; i < pred->successorsNum(); ++i) {
                if (pred->_successors[i] == n)
                    pred->_successors[i] = static_cast<NodeT *>(this);
            }
        }
    }